

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O0

void handle_shemu(PDISASM_OPTIONS Options)

{
  uint8_t *__src;
  ulong uVar1;
  char *__s;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  SHEMU_STATUS SVar9;
  size_t sVar10;
  FILE *__s_00;
  size_t sVar11;
  long in_FS_OFFSET;
  ND_UINT64 *local_ff8;
  FILE *file;
  size_t outSize;
  uint32_t fli;
  PBYTE buffer;
  char *fNameDecoded;
  size_t shellSize;
  size_t decFileNameLength;
  size_t offset;
  size_t fsize;
  size_t rip;
  char *fileName;
  SHEMU_STATUS shstatus;
  PDISASM_OPTIONS Options_local;
  anon_struct_16_2_3d4e5138 shemuFlags [15];
  int regs [4];
  SHEMU_CONTEXT ctx;
  
  ctx.LogContext = *(void **)(in_FS_OFFSET + 0x28);
  sVar11 = Options->Size;
  __src = Options->Buffer;
  memset(regs + 2,0,0xe78);
  uVar1 = Options->Rip;
  __s = Options->FileName;
  if ((Options->SkipWriteDecoded & 1U) == 0) {
    if (__s == (char *)0x0) {
      buffer = "hex_string_decoded.bin";
    }
    else {
      sVar10 = strlen(__s);
      buffer = (PBYTE)malloc(sVar10 + 0xd);
      sprintf((char *)buffer,"%s_decoded.bin",__s);
    }
  }
  else {
    buffer = (PBYTE)0x0;
  }
  sVar2 = Options->Offset;
  sVar10 = sVar11 + 0x100;
  ctx.LoopTrack._24_8_ = malloc(sVar10);
  ctx.Shellcode = (ND_UINT8 *)malloc(0x2000);
  ctx.Stack = (ND_UINT8 *)malloc(sVar11 + 0x2100);
  memset((void *)ctx.LoopTrack._24_8_,0,sVar10);
  memset(ctx.Shellcode,0,0x2000);
  memcpy((void *)ctx.LoopTrack._24_8_,__src,sVar11);
  memset(ctx.Stack,0,sVar11 + 0x2100);
  if (uVar1 == 0) {
    local_ff8 = &gInstructions[0xf9e].CpuidFlag;
  }
  else {
    local_ff8 = (ND_UINT64 *)(uVar1 & 0xfffffffffffff000);
  }
  ctx.Intbuf = (ND_UINT8 *)local_ff8;
  ctx.ShellcodeBase = (ND_UINT64)(local_ff8 + -0x600);
  ctx.ShellcodeSize = 0x2000;
  ctx.StackSize = sVar11 + 0x2100;
  ctx.Arch._3184_4_ = 1;
  ctx.Arch.X86.GprTracker[0x18] = Options->Mode;
  ctx.Arch.X86.GprTracker[0x19] = Options->Ring;
  ctx.Arch.X86.Registers.RegCr2 = 0x202;
  ctx.Arch.X86.Registers.RegDr7 = (long)local_ff8 + sVar2;
  ctx.Arch.X86.Registers.RegRbx = (ND_UINT64)(local_ff8 + -0x400);
  if (ctx.Arch.X86.GprTracker[0x18] == '\x02') {
    iVar3 = 0x10;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar3 = 0x33;
    }
    iVar4 = 0x18;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar4 = 0x2b;
    }
    iVar5 = 0x18;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar5 = 0x2b;
    }
    iVar6 = 0x18;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar6 = 0x2b;
    }
    iVar7 = 0;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar7 = 0x2b;
    }
    iVar8 = 0;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar8 = 0x53;
    }
    ctx.Arch.X86.Segments.Ds.AccessRights = 0;
    ctx.Arch.X86.Segments.Fs.AccessRights = 0x7fff0000;
  }
  else {
    iVar3 = 8;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar3 = 0x1b;
    }
    iVar4 = 0x10;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar4 = 0x23;
    }
    iVar5 = 0x10;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar5 = 0x23;
    }
    iVar6 = 0x10;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar6 = 0x23;
    }
    iVar7 = 0x30;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar7 = 0x3b;
    }
    iVar8 = 0;
    if (ctx.Arch.X86.GprTracker[0x19] == '\x03') {
      iVar8 = 0x23;
    }
    ctx.Arch.X86.Segments.Ds.AccessRights = 0x7fff0000;
    ctx.Arch.X86.Segments.Fs.AccessRights = 0;
  }
  ctx.Arch.X86.Segments.Gs.Limit = (ND_UINT64)iVar8;
  ctx.Arch.X86.Segments.Fs.Limit = (ND_UINT64)iVar7;
  ctx.Arch.X86.Segments.Ds.Limit = (ND_UINT64)iVar4;
  ctx.Arch.X86.Segments.Ss.Limit = (ND_UINT64)iVar6;
  ctx.Arch.X86.Segments.Cs.Limit = (ND_UINT64)iVar3;
  ctx.Arch.X86.Segments.Es.Limit = (ND_UINT64)iVar5;
  ctx.Arch.X86.Registers.RegRip = 0x80050031;
  ctx.Arch.X86.Registers.RegCr0 = 0x170678;
  ctx.StackBase = sVar10;
  if (((Options->UseShemuRegs & 1U) != 0) &&
     (memcpy((void *)((long)&ctx.Arch + 0x1e0),Options->ShemuRegs,0x100),
     ctx.Arch.X86.Registers.RegRbx != 0)) {
    ctx.ShellcodeBase = ctx.Arch.X86.Registers.RegRbx - 0x1000;
  }
  ctx.MaxInstructionsCount = 0x7fff0000;
  ctx.UniqueCount = 10000;
  ctx.TibBase = 0;
  ctx.Flags = 0x99;
  ctx.AuxData = ShemuLog;
  ctx.Log = ShemuAccessMem;
  ctx.AccessMemory = ShemuAccessShellcode;
  ctx.Options._0_4_ = 0x4b;
  ctx.Options._4_4_ = 8;
  ctx.NopThreshold = 0;
  memset(&shemuFlags[0xe].Name,0,0x10);
  cpuid((int *)&shemuFlags[0xe].Name,1);
  if ((regs[0] & 0x2000000U) != 0) {
    ctx.Flags = ctx.Flags | 0x100000000;
  }
  if ((Options->BypassSelfWrites & 1U) != 0) {
    ctx.Flags = ctx.Flags | 4;
  }
  ctx.Flags = ctx.Flags | 0x200000000;
  SVar9 = ShemuX86Emulate((SHEMU_CONTEXT *)(regs + 2));
  printf("Emulation terminated with status 0x%08x, flags: 0x%llx, %llu NOPs, %llu NULLs, %llu total instructions, %llu unique instructions\n"
         ,(ulong)SVar9,ctx.TibBase,ctx.IntbufSize,ctx.NopCount,ctx.ExtMemAccess,
         ctx.InstructionsCount);
  memcpy(&Options_local,&DAT_0020a2b0,0xf0);
  for (outSize._4_4_ = 0; outSize._4_4_ < 0xf; outSize._4_4_ = outSize._4_4_ + 1) {
    if ((ctx.TibBase & (ulong)shemuFlags[(ulong)outSize._4_4_ - 1].Name) != 0) {
      printf("        %s\n",shemuFlags[outSize._4_4_].Flag);
    }
  }
  if (buffer != (PBYTE)0x0) {
    __s_00 = fopen((char *)buffer,"wb");
    if (__s_00 == (FILE *)0x0) {
      printf("Could not create the file %s\n",buffer);
    }
    else {
      sVar11 = fwrite((void *)ctx.LoopTrack._24_8_,1,sVar11,__s_00);
      if (sVar11 == 0) {
        printf("No bytes written to %s!\n",buffer);
      }
      fclose(__s_00);
    }
  }
  if ((__s != (char *)0x0) && (buffer != (PBYTE)0x0)) {
    free(buffer);
  }
  if (ctx.LoopTrack._24_8_ != 0) {
    free((void *)ctx.LoopTrack._24_8_);
  }
  if (ctx.Shellcode != (ND_UINT8 *)0x0) {
    free(ctx.Shellcode);
  }
  if (ctx.Stack != (ND_UINT8 *)0x0) {
    free(ctx.Stack);
  }
  if (*(void **)(in_FS_OFFSET + 0x28) != ctx.LogContext) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
handle_shemu(
    PDISASM_OPTIONS Options
    )
{
    SHEMU_CONTEXT ctx;
    SHEMU_STATUS shstatus;
    char *fileName;
    size_t rip = 0, fsize = Options->Size, offset = 0, decFileNameLength = 0, shellSize;
    char *fNameDecoded;
    PBYTE buffer = Options->Buffer;

    memset(&ctx, 0, sizeof(ctx));
    rip = Options->Rip;
    fileName = Options->FileName;

    if (!Options->SkipWriteDecoded)
    {
        if (fileName == NULL)
        {
            fNameDecoded = "hex_string_decoded.bin";
        }
        else
        {
            decFileNameLength = strlen(fileName) + sizeof("_decoded.bin");
            fNameDecoded = malloc(sizeof(char) * decFileNameLength);
        
            // This is safe, we allocated enough space.
            sprintf(fNameDecoded, "%s_decoded.bin", fileName);
        }
    }
    else
    {
        fNameDecoded = NULL;
    }

    offset = Options->Offset;

    // A little extra space, since shellcodes tend to do accesses after their code...
    shellSize = fsize + 0x100;

    // Allocate the shellcode, stack, shell bitmap and stack bitmaps.
    ctx.Shellcode = malloc(shellSize);

#define STACK_SIZE  0x2000ull
    ctx.Stack = malloc(STACK_SIZE);
    ctx.Intbuf = malloc(shellSize + STACK_SIZE);

    memset(ctx.Shellcode, 0, shellSize);
    memset(ctx.Stack, 0, STACK_SIZE);
    memcpy(ctx.Shellcode, buffer, fsize);
    memset(ctx.Intbuf, 0, shellSize + STACK_SIZE);

    // Use the provided RIP, if any. Otherwise, use a hard-coded value.
    ctx.ShellcodeBase = (rip != 0 ? rip & PAGE_MASK : 0x200000);
    ctx.ShellcodeSize = shellSize;
    ctx.StackBase = (ctx.ShellcodeBase & PAGE_MASK) - STACK_SIZE - 0x1000;
    ctx.StackSize = STACK_SIZE;
    
    ctx.IntbufSize = shellSize + STACK_SIZE;

    ctx.ArchType = SHEMU_ARCH_TYPE_X86;

    ctx.Arch.X86.Mode = Options->Mode;
    ctx.Arch.X86.Ring = Options->Ring;

    ctx.Arch.X86.Registers.RegFlags = NDR_RFLAG_IF | 2;
    ctx.Arch.X86.Registers.RegRip = ctx.ShellcodeBase + offset;
    ctx.Arch.X86.Registers.RegRsp = ctx.StackBase + STACK_SIZE / 2;

    if (ctx.Arch.X86.Mode == ND_CODE_64)
    {
        ctx.Arch.X86.Segments.Cs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x33 : 0x10;
        ctx.Arch.X86.Segments.Ds.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x18;
        ctx.Arch.X86.Segments.Es.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x18;
        ctx.Arch.X86.Segments.Ss.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x18;
        ctx.Arch.X86.Segments.Fs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x00;
        ctx.Arch.X86.Segments.Gs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x53 : 0x00;

        ctx.Arch.X86.Segments.Fs.Base = 0;
        ctx.Arch.X86.Segments.Gs.Base = 0x7FFF0000;
    }
    else
    {
        ctx.Arch.X86.Segments.Cs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x1b : 0x08;
        ctx.Arch.X86.Segments.Ds.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x10;
        ctx.Arch.X86.Segments.Es.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x10;
        ctx.Arch.X86.Segments.Ss.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x10;
        ctx.Arch.X86.Segments.Fs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x3b : 0x30;
        ctx.Arch.X86.Segments.Gs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x00;

        ctx.Arch.X86.Segments.Fs.Base = 0x7FFF0000;
        ctx.Arch.X86.Segments.Gs.Base = 0;
    }

    // Dummy values, to resemble regular CR0/CR4 values.
    ctx.Arch.X86.Registers.RegCr0 = 0x0000000080050031;
    ctx.Arch.X86.Registers.RegCr4 = 0x0000000000170678;

    if (Options->UseShemuRegs)
    {
        // Copy the new GPRs
        memcpy(&ctx.Arch.X86.Registers.RegRax, Options->ShemuRegs, sizeof(Options->ShemuRegs));

        // Update the stack to point to the new RSP, if one exists
        if (ctx.Arch.X86.Registers.RegRsp != 0)
        {
            // Consider the stack base at least with a page before the current RSP. In case of pushes or operations
            // which decrease the RSP, we will always give SHEMU_ABORT_RIP_OUTSIDE otherwise.
            ctx.StackBase = ctx.Arch.X86.Registers.RegRsp - 0x1000;
        }
    }

    ctx.TibBase = 0x7FFF0000;
    ctx.MaxInstructionsCount = 10000;
    ctx.Flags = 0;
    ctx.Options = SHEMU_OPT_TRACE_EMULATION | SHEMU_OPT_TRACE_MEMORY | SHEMU_OPT_TRACE_STRINGS | SHEMU_OPT_TRACE_LOOPS;
    ctx.Log = &ShemuLog;
    ctx.AccessMemory = (ShemuMemAccess)&ShemuAccessMem;
    ctx.AccessShellcode = (ShemuMemAccess)&ShemuAccessShellcode;

    // Configurable thresholds.
    ctx.NopThreshold = SHEMU_DEFAULT_NOP_THRESHOLD;
    ctx.StrThreshold = SHEMU_DEFAULT_STR_THRESHOLD;
    ctx.MemThreshold = SHEMU_DEFAULT_MEM_THRESHOLD;

    // Check for AES support.
    int regs[4] = { 0 };

#if defined(ND_ARCH_X86) || defined(ND_ARCH_X64)
    cpuid(regs, 1);
#endif

    // CPUID leaf function 1, register ECX, bit 25 indicates AES-NI support.
    if (!!(regs[2] & (1UL << 25)))
    {
        ctx.Options |= SHEMU_OPT_SUPPORT_AES;
    }

    if (Options->BypassSelfWrites)
    {
        ctx.Options |= SHEMU_OPT_BYPASS_SELF_WRITES;
    }

    ctx.Options |= SHEMU_OPT_SUPPORT_APX;

    shstatus = ShemuX86Emulate(&ctx);

    // Print each set flag after emulation.
    printf("Emulation terminated with status 0x%08x, flags: 0x%llx, %llu NOPs, %llu NULLs, %llu total instructions, %llu unique instructions\n", 
           shstatus, (unsigned long long)ctx.Flags, ctx.NopCount, ctx.NullCount, ctx.InstructionsCount, ctx.UniqueCount);
    
    struct 
    {
        ND_UINT64   Flag;
        const char* Name;
    } const shemuFlags[] = {
#define FLAGENTRY(f)       { .Flag = f, .Name = #f }
        FLAGENTRY(SHEMU_FLAG_NOP_SLED),
        FLAGENTRY(SHEMU_FLAG_LOAD_RIP),
        FLAGENTRY(SHEMU_FLAG_WRITE_SELF),
        FLAGENTRY(SHEMU_FLAG_TIB_ACCESS_PEB),
        FLAGENTRY(SHEMU_FLAG_SYSCALL),
        FLAGENTRY(SHEMU_FLAG_STACK_STR),
        FLAGENTRY(SHEMU_FLAG_TIB_ACCESS_WOW32),
        FLAGENTRY(SHEMU_FLAG_HEAVENS_GATE),
        FLAGENTRY(SHEMU_FLAG_STACK_PIVOT),
        FLAGENTRY(SHEMU_FLAG_SUD_ACCESS),
        FLAGENTRY(SHEMU_FLAG_KPCR_ACCESS),
        FLAGENTRY(SHEMU_FLAG_SWAPGS),
        FLAGENTRY(SHEMU_FLAG_SYSCALL_MSR_READ),
        FLAGENTRY(SHEMU_FLAG_SYSCALL_MSR_WRITE),
        FLAGENTRY(SHEMU_FLAG_SIDT),
#undef  FLAGENTRY
    };

    for (uint32_t fli = 0; fli < ARRAYSIZE(shemuFlags); fli++)
    {
        if (ctx.Flags & shemuFlags[fli].Flag)
        {
            printf("        %s\n", shemuFlags[fli].Name);
        }
    }

    if (fNameDecoded != NULL)
    {
        size_t outSize;
        FILE *file = fopen(fNameDecoded, "wb");
        if (file == NULL)
        {
            printf("Could not create the file %s\n", fNameDecoded);
            goto cleanup_and_exit;
        }

        outSize = fwrite(ctx.Shellcode, 1, fsize, file);

        if (outSize == 0)
        {
            printf("No bytes written to %s!\n", fNameDecoded);
        }

        fclose(file);
    }

cleanup_and_exit:
    if (NULL != fileName && NULL != fNameDecoded)
    {
        free(fNameDecoded);
    }

    if (NULL != ctx.Shellcode)
    {
        free(ctx.Shellcode);
    }

    if (NULL != ctx.Stack)
    {
        free(ctx.Stack);
    }

    if (NULL != ctx.Intbuf)
    {
        free(ctx.Intbuf);
    }
}